

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::ColorEditOptionsPopup(float *col,ImGuiColorEditFlags flags)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  int iVar6;
  float local_d4;
  int local_ac;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  char local_88 [8];
  char buf [64];
  int ca;
  int cb;
  int cg;
  int cr;
  uint local_24;
  ImGuiContext *pIStack_20;
  ImGuiColorEditFlags opts;
  ImGuiContext *g;
  bool allow_opt_datatype;
  bool allow_opt_inputs;
  float *pfStack_10;
  ImGuiColorEditFlags flags_local;
  float *col_local;
  
  g._3_1_ = ((flags & 0x700000U) != 0 ^ 0xffU) & 1;
  g._2_1_ = ((flags & 0x1800000U) != 0 ^ 0xffU) & 1;
  if (((g._3_1_ != 0) || (g._2_1_ != 0)) &&
     (g._4_4_ = flags, pfStack_10 = col, bVar1 = BeginPopup("context",0), bVar1)) {
    pIStack_20 = GImGui;
    local_24 = GImGui->ColorEditOptions;
    if ((g._3_1_ & 1) != 0) {
      bVar1 = RadioButton("RGB",(local_24 & 0x100000) != 0);
      if (bVar1) {
        local_24 = local_24 & 0xff8fffff | 0x100000;
      }
      bVar1 = RadioButton("HSV",(local_24 & 0x200000) != 0);
      if (bVar1) {
        local_24 = local_24 & 0xff8fffff | 0x200000;
      }
      bVar1 = RadioButton("Hex",(local_24 & 0x400000) != 0);
      if (bVar1) {
        local_24 = local_24 & 0xff8fffff | 0x400000;
      }
    }
    if ((g._2_1_ & 1) != 0) {
      if ((g._3_1_ & 1) != 0) {
        Separator();
      }
      bVar1 = RadioButton("0..255",(local_24 & 0x800000) != 0);
      if (bVar1) {
        local_24 = local_24 & 0xfe7fffff | 0x800000;
      }
      bVar1 = RadioButton("0.00..1.00",(local_24 & 0x1000000) != 0);
      if (bVar1) {
        local_24 = local_24 & 0xfe7fffff | 0x1000000;
      }
    }
    if (((g._3_1_ & 1) != 0) || ((g._2_1_ & 1) != 0)) {
      Separator();
    }
    ImVec2::ImVec2((ImVec2 *)&cg,-1.0,0.0);
    bVar1 = Button("Copy as..",(ImVec2 *)&cg);
    if (bVar1) {
      OpenPopup("Copy",0);
    }
    bVar1 = BeginPopup("Copy",0);
    if (bVar1) {
      fVar5 = ImSaturate(*pfStack_10);
      uVar2 = (uint)(fVar5 * 255.0 + 0.5);
      fVar5 = ImSaturate(pfStack_10[1]);
      uVar3 = (uint)(fVar5 * 255.0 + 0.5);
      fVar5 = ImSaturate(pfStack_10[2]);
      uVar4 = (uint)(fVar5 * 255.0 + 0.5);
      if ((g._4_4_ & 2) == 0) {
        fVar5 = ImSaturate(pfStack_10[3]);
        local_ac = (int)(fVar5 * 255.0 + 0.5);
      }
      else {
        local_ac = 0xff;
      }
      if ((g._4_4_ & 2) == 0) {
        local_d4 = pfStack_10[3];
      }
      else {
        local_d4 = 1.0;
      }
      ImFormatString(local_88,0x40,"(%.3ff, %.3ff, %.3ff, %.3ff)",(double)*pfStack_10,
                     (double)pfStack_10[1],(double)pfStack_10[2],(double)local_d4);
      ImVec2::ImVec2(&local_90,0.0,0.0);
      bVar1 = Selectable(local_88,false,0,&local_90);
      if (bVar1) {
        SetClipboardText(local_88);
      }
      iVar6 = local_ac;
      ImFormatString(local_88,0x40,"(%d,%d,%d,%d)",(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,local_ac);
      ImVec2::ImVec2(&local_98,0.0,0.0);
      bVar1 = Selectable(local_88,false,0,&local_98);
      if (bVar1) {
        SetClipboardText(local_88);
      }
      ImFormatString(local_88,0x40,"#%02X%02X%02X",(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,iVar6);
      ImVec2::ImVec2(&local_a0,0.0,0.0);
      bVar1 = Selectable(local_88,false,0,&local_a0);
      if (bVar1) {
        SetClipboardText(local_88);
      }
      if ((g._4_4_ & 2) == 0) {
        ImFormatString(local_88,0x40,"#%02X%02X%02X%02X",(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,
                       local_ac);
        ImVec2::ImVec2(&local_a8,0.0,0.0);
        bVar1 = Selectable(local_88,false,0,&local_a8);
        if (bVar1) {
          SetClipboardText(local_88);
        }
      }
      EndPopup();
    }
    pIStack_20->ColorEditOptions = local_24;
    EndPopup();
  }
  return;
}

Assistant:

void ImGui::ColorEditOptionsPopup(const float* col, ImGuiColorEditFlags flags)
{
    bool allow_opt_inputs = !(flags & ImGuiColorEditFlags_DisplayMask_);
    bool allow_opt_datatype = !(flags & ImGuiColorEditFlags_DataTypeMask_);
    if ((!allow_opt_inputs && !allow_opt_datatype) || !BeginPopup("context"))
        return;
    ImGuiContext& g = *GImGui;
    ImGuiColorEditFlags opts = g.ColorEditOptions;
    if (allow_opt_inputs)
    {
        if (RadioButton("RGB", (opts & ImGuiColorEditFlags_DisplayRGB) != 0)) opts = (opts & ~ImGuiColorEditFlags_DisplayMask_) | ImGuiColorEditFlags_DisplayRGB;
        if (RadioButton("HSV", (opts & ImGuiColorEditFlags_DisplayHSV) != 0)) opts = (opts & ~ImGuiColorEditFlags_DisplayMask_) | ImGuiColorEditFlags_DisplayHSV;
        if (RadioButton("Hex", (opts & ImGuiColorEditFlags_DisplayHex) != 0)) opts = (opts & ~ImGuiColorEditFlags_DisplayMask_) | ImGuiColorEditFlags_DisplayHex;
    }
    if (allow_opt_datatype)
    {
        if (allow_opt_inputs) Separator();
        if (RadioButton("0..255",     (opts & ImGuiColorEditFlags_Uint8) != 0)) opts = (opts & ~ImGuiColorEditFlags_DataTypeMask_) | ImGuiColorEditFlags_Uint8;
        if (RadioButton("0.00..1.00", (opts & ImGuiColorEditFlags_Float) != 0)) opts = (opts & ~ImGuiColorEditFlags_DataTypeMask_) | ImGuiColorEditFlags_Float;
    }

    if (allow_opt_inputs || allow_opt_datatype)
        Separator();
    if (Button("Copy as..", ImVec2(-1, 0)))
        OpenPopup("Copy");
    if (BeginPopup("Copy"))
    {
        int cr = IM_F32_TO_INT8_SAT(col[0]), cg = IM_F32_TO_INT8_SAT(col[1]), cb = IM_F32_TO_INT8_SAT(col[2]), ca = (flags & ImGuiColorEditFlags_NoAlpha) ? 255 : IM_F32_TO_INT8_SAT(col[3]);
        char buf[64];
        ImFormatString(buf, IM_ARRAYSIZE(buf), "(%.3ff, %.3ff, %.3ff, %.3ff)", col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
        if (Selectable(buf))
            SetClipboardText(buf);
        ImFormatString(buf, IM_ARRAYSIZE(buf), "(%d,%d,%d,%d)", cr, cg, cb, ca);
        if (Selectable(buf))
            SetClipboardText(buf);
        ImFormatString(buf, IM_ARRAYSIZE(buf), "#%02X%02X%02X", cr, cg, cb);
        if (Selectable(buf))
            SetClipboardText(buf);
        if (!(flags & ImGuiColorEditFlags_NoAlpha))
        {
            ImFormatString(buf, IM_ARRAYSIZE(buf), "#%02X%02X%02X%02X", cr, cg, cb, ca);
            if (Selectable(buf))
                SetClipboardText(buf);
        }
        EndPopup();
    }

    g.ColorEditOptions = opts;
    EndPopup();
}